

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_pts_landmarks.hpp
# Opt level: O0

LandmarkCollection<Eigen::Vector2f> *
eos::core::read_pts_landmarks
          (LandmarkCollection<Eigen::Vector2f> *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  Scalar *pSVar5;
  void *this;
  long *plVar6;
  runtime_error *prVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string local_458;
  undefined1 local_438 [8];
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> landmark;
  stringstream lineStream;
  int local_284;
  undefined1 local_280 [4];
  int ibugId;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238;
  ifstream file;
  string *filename_local;
  LandmarkCollection<Vector2f> *landmarks;
  
  std::
  vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  ::reserve(__return_storage_ptr__,0x44);
  std::ifstream::ifstream(&local_238,(string *)filename,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar1 & 1) != 0) {
    line.field_2._M_local_buf[0xf] = '\x01';
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_258,"Could not open landmark file: ",filename);
    std::runtime_error::runtime_error(prVar7,(string *)&local_258);
    line.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)local_280);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_238,(string *)local_280);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_238,(string *)local_280);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_238,(string *)local_280);
  local_284 = 1;
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_238,(string *)local_280);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if ((!bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_280,"}"), bVar2)) break;
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&landmark.coordinates,(string *)local_280,_Var3);
    Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::Landmark
              ((Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_438);
    std::__cxx11::to_string(&local_458,local_284);
    std::__cxx11::string::operator=((string *)local_438,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                        (landmark.name.field_2._M_local_buf + 8),0);
    this = (void *)std::istream::operator>>(&landmark.coordinates,pSVar5);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                        (landmark.name.field_2._M_local_buf + 8),1);
    plVar6 = (long *)std::istream::operator>>(this,pSVar5);
    bVar1 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    if ((bVar1 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_478,"Landmark format error while parsing the line: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
      ;
      std::runtime_error::runtime_error(prVar7,(string *)&local_478);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                        (landmark.name.field_2._M_local_buf + 8),0);
    *pSVar5 = *pSVar5 + -1.0;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)
                        (landmark.name.field_2._M_local_buf + 8),1);
    *pSVar5 = *pSVar5 + -1.0;
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>
    ::emplace_back<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>&>
              ((vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>
                *)__return_storage_ptr__,(Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_438
              );
    local_284 = local_284 + 1;
    Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::~Landmark
              ((Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_438);
    std::__cxx11::stringstream::~stringstream((stringstream *)&landmark.coordinates);
  }
  std::__cxx11::string::~string((string *)local_280);
  std::ifstream::~ifstream(&local_238);
  return __return_storage_ptr__;
}

Assistant:

inline LandmarkCollection<Eigen::Vector2f> read_pts_landmarks(std::string filename)
{
    using Eigen::Vector2f;
    using std::getline;
    using std::string;
    LandmarkCollection<Vector2f> landmarks;
    landmarks.reserve(68);

    std::ifstream file(filename);
    if (!file)
    {
        throw std::runtime_error(string("Could not open landmark file: " + filename));
    }

    string line;
    // Skip the first 3 lines, they're header lines:
    getline(file, line); // 'version: 1'
    getline(file, line); // 'n_points : 68'
    getline(file, line); // '{'

    int ibugId = 1;
    while (getline(file, line))
    {
        if (line == "}")
        { // end of the file
            break;
        }
        std::stringstream lineStream(line);

        Landmark<Vector2f> landmark;
        landmark.name = std::to_string(ibugId);
        if (!(lineStream >> landmark.coordinates[0] >> landmark.coordinates[1]))
        {
            throw std::runtime_error(string("Landmark format error while parsing the line: " + line));
        }
        // From the iBug website:
        // "Please note that the re-annotated data for this challenge are saved in the Matlab convention of 1
        // being the first index, i.e. the coordinates of the top left pixel in an image are x=1, y=1."
        // ==> So we shift every point by 1:
        landmark.coordinates[0] -= 1.0f;
        landmark.coordinates[1] -= 1.0f;
        landmarks.emplace_back(landmark);
        ++ibugId;
    }
    return landmarks;
}